

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O0

RC __thiscall QL_NodeSel::GetNextRec(QL_NodeSel *this,RM_Record *rec)

{
  RC RVar1;
  char *pcStack_30;
  RC cond;
  char *pData;
  RM_Record *pRStack_20;
  RC rc;
  RM_Record *rec_local;
  QL_NodeSel *this_local;
  
  pData._4_4_ = 0;
  pRStack_20 = rec;
  rec_local = (RM_Record *)this;
  while( true ) {
    pData._4_4_ = (*this->prevNode->_vptr_QL_Node[2])(this->prevNode,pRStack_20);
    if (pData._4_4_ != 0) {
      return pData._4_4_;
    }
    pData._4_4_ = RM_Record::GetData(pRStack_20,&stack0xffffffffffffffd0);
    if (pData._4_4_ != 0) break;
    RVar1 = QL_Node::CheckConditions(&this->super_QL_Node,pcStack_30);
    if (RVar1 == 0) {
      return 0;
    }
  }
  return pData._4_4_;
}

Assistant:

RC QL_NodeSel::GetNextRec(RM_Record &rec){
  RC rc = 0;
  while(true){
    if((rc = prevNode.GetNextRec(rec)))
      return (rc);

    char *pData;
    if((rc = rec.GetData(pData)))
      return (rc);

    RC cond = CheckConditions(pData);
    if(cond ==0)
      break;
  }

  return (0);
}